

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall S2Builder::push_label(S2Builder *this,Label label)

{
  iterator __position;
  Label local_1c;
  S2LogMessage local_18;
  
  local_1c = label;
  if (-1 < label) {
    __position._M_current =
         (this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->label_set_,__position,&local_1c);
    }
    else {
      *__position._M_current = label;
      (this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->label_set_modified_ = true;
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x126,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_18.stream_,"Check failed: (label) >= (0) ",0x1d);
  abort();
}

Assistant:

void S2Builder::push_label(Label label) {
  S2_DCHECK_GE(label, 0);
  label_set_.push_back(label);
  label_set_modified_ = true;
}